

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  int s;
  char *pcVar1;
  pair<const_char_*,_bool> pVar2;
  anon_class_8_1_ba1d7991 local_38;
  
  pcVar1 = this->buffer_end_;
  if ((long)size <= (long)(pcVar1 + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
    pcVar1 = this->buffer_end_;
  }
  s = ((int)pcVar1 - (int)ptr) + 0x10;
  local_38.str = str;
  while( true ) {
    AppendStringFallback::anon_class_8_1_ba1d7991::operator()(&local_38,ptr,s);
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar2 = DoneFallback(this,ptr + s,-1);
    ptr = pVar2.first;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    size = size - s;
    s = (*(int *)&this->buffer_end_ - (int)pVar2.first) + 0x10;
    if (size <= s) {
      AppendStringFallback::anon_class_8_1_ba1d7991::operator()(&local_38,ptr,size);
      return ptr + size;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  // TODO(gerbens) assess security. At the moment its parity with
  // CodedInputStream but it allows a payload to reserve large memory.
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    str->reserve(size);
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}